

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void voc_push_toklist(voccxdef *ctx,char **wordlist,int cnt)

{
  int iVar1;
  size_t sVar2;
  uchar *puVar3;
  int in_EDX;
  voccxdef *in_RSI;
  size_t copy_len;
  char *cur_ptr;
  size_t cur_len;
  uchar *lstp;
  uint lstsiz;
  char **p;
  int i;
  size_t local_48;
  errcxdef *local_40;
  size_t local_38;
  uchar *local_30;
  uint lstsiz_00;
  voccxdef *ctx_00;
  int local_18;
  
  lstsiz_00 = 0;
  ctx_00 = in_RSI;
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    if (*(char *)&ctx_00->voccxerr->errcxptr == '\"') {
      local_38._0_4_ = osrp2((void *)((long)&ctx_00->voccxerr->errcxptr + 1));
    }
    else {
      sVar2 = strlen((char *)ctx_00->voccxerr);
      local_38._0_4_ = (int)sVar2;
    }
    lstsiz_00 = lstsiz_00 + (int)local_38 + 3;
    ctx_00 = (voccxdef *)&ctx_00->voccxtio;
  }
  local_30 = voc_push_list_siz(ctx_00,lstsiz_00);
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    *local_30 = '\x03';
    if (*(char *)&in_RSI->voccxerr->errcxptr == '\"') {
      iVar1 = osrp2((void *)((long)&in_RSI->voccxerr->errcxptr + 1));
      local_48 = (size_t)(iVar1 + -2);
      local_38 = local_48 + 2;
      local_40 = (errcxdef *)((long)&in_RSI->voccxerr->errcxptr + 3);
    }
    else {
      local_48 = strlen((char *)in_RSI->voccxerr);
      local_40 = in_RSI->voccxerr;
      local_38 = local_48;
    }
    oswp2(local_30 + 1,(int)local_38 + 2);
    puVar3 = local_30 + 3;
    if (*(char *)&in_RSI->voccxerr->errcxptr == '\"') {
      local_30[3] = '\"';
      puVar3 = local_30 + 4;
    }
    local_30 = puVar3;
    memcpy(local_30,local_40,local_48);
    puVar3 = local_30 + local_48;
    local_30 = puVar3;
    if (*(char *)&in_RSI->voccxerr->errcxptr == '\"') {
      local_30 = puVar3 + 1;
      *puVar3 = '\"';
    }
    in_RSI = (voccxdef *)&in_RSI->voccxtio;
  }
  return;
}

Assistant:

static void voc_push_toklist(voccxdef *ctx, char *wordlist[], int cnt)
{
    int i;
    char **p;
    uint lstsiz;
    uchar *lstp;
    size_t cur_len;

    /* 
     *   Add up the lengths of the strings in the array.  For each
     *   element, we need space for the string's bytes, plus two bytes for
     *   the length prefix, plus one byte for the type prefix.  
     */
    for (lstsiz = 0, p = wordlist, i = 0 ; i < cnt ; ++i, ++p)
    {
        /* 
         *   get the length of the current token - check what kind of
         *   token we have, since we must sense the length of different
         *   token types in different ways 
         */
        if (**p == '"')
        {
            /* 
             *   It's a string token - the string follows with a two-byte
             *   length prefix; add two bytes for the open and close quote
             *   characters that we'll add to the output string.  Note
             *   that we must deduct two bytes from the prefix length,
             *   because the prefix includes the size of the prefix
             *   itself, which we're not copying and will account for
             *   separately in the result string.
             */
            cur_len = osrp2(*p + 1) - 2 + 2;
        }
        else
        {
            /* for anything else, it's just a null-terminated string */
            cur_len = strlen(*p);
        }

        /* add the current length to the total so far */
        lstsiz += cur_len + 3;
    }

    /* allocate space for the list */
    lstp = voc_push_list_siz(ctx, lstsiz);

    /* enter the list elements */
    for (p = wordlist, i = 0 ; i < cnt ; ++i, ++p)
    {
        char *cur_ptr;
        size_t copy_len;
        
        /* add the type prefix */
        *lstp++ = DAT_SSTRING;

        /* get the information for the string based on the type */
        if (**p == '"')
        {
            /* 
             *   it's a string - use the length prefix (deducting two
             *   bytes for the prefix itself, which we're not copying) 
             */
            copy_len = osrp2(*p + 1) - 2;

            /* add space in the result for the open and close quotes */
            cur_len = copy_len + 2;

            /* the string itself follows the length prefix and '"' flag */
            cur_ptr = *p + 3;
        }
        else
        {
            /* for anything else, it's just a null-terminated string */
            cur_len = copy_len = strlen(*p);
            cur_ptr = *p;
        }

        /* write the length prefix for this string */
        oswp2(lstp, cur_len + 2);
        lstp += 2;

        /* add the open quote if this is a quoted string */
        if (**p == '"')
            *lstp++ = '"';

        /* add this string */
        memcpy(lstp, cur_ptr, copy_len);
        lstp += copy_len;

        /* add the close quote if it's a quoted string */
        if (**p == '"')
            *lstp++ = '"';
    }
}